

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::GetItemAccessors
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,DynamicObject *instance,uint32 index,
          Var *getter,Var *setter)

{
  bool bVar1;
  BOOL BVar2;
  uint uVar3;
  uint32 local_44;
  void *local_40;
  int i;
  IndexPropertyDescriptor *descriptor;
  
  local_44 = index;
  bVar1 = JsUtil::
          BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<unsigned_int>
                    ((((this->indexPropertyMap).ptr)->indexPropertyMap).ptr,&local_44,
                     (IndexPropertyDescriptor **)&i,(int *)&local_40);
  uVar3 = 0;
  if ((bVar1) && ((_i->Attributes & 8) == 0)) {
    BVar2 = JavascriptArray::DirectGetItemAt<void*>(&arr->super_JavascriptArray,index,&local_40);
    uVar3 = 0;
    if (BVar2 == 0) {
      *getter = (_i->Getter).ptr;
      *setter = (_i->Setter).ptr;
      uVar3 = 1;
      if ((_i->Getter).ptr == (void *)0x0) {
        uVar3 = (uint)((_i->Setter).ptr != (void *)0x0);
      }
    }
  }
  return uVar3;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::GetItemAccessors(ES5Array* arr, DynamicObject* instance, uint32 index, Var* getter, Var* setter)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return false;
            }

            if (!HasDataItem(arr, index)) // if not shadowed by data item
            {
                *getter = descriptor->Getter;
                *setter = descriptor->Setter;
                return descriptor->Getter || descriptor->Setter;
            }
        }

        return false;
    }